

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

void __thiscall Camera::updateCameraVectors(Camera *this)

{
  float fVar1;
  double dVar2;
  double dVar3;
  vec<3,_float,_(glm::qualifier)0> vVar4;
  undefined8 local_b0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_a8;
  vec<3,_float,_(glm::qualifier)0> local_a0;
  vec<3,_float,_(glm::qualifier)0> local_90 [2];
  vec<3,_float,_(glm::qualifier)0> local_78;
  vec<3,_float,_(glm::qualifier)0> local_68;
  vec<3,_float,_(glm::qualifier)0> local_58;
  undefined8 local_48;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_40;
  vec<3,_float,_(glm::qualifier)0> local_38;
  undefined8 local_28;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_20;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_1c;
  float local_18;
  vec3 front;
  Camera *this_local;
  
  front._4_8_ = this;
  fVar1 = glm::radians<float>(this->Yaw);
  dVar2 = cos((double)fVar1);
  fVar1 = glm::radians<float>(this->Pitch);
  dVar3 = cos((double)fVar1);
  local_1c.x = (float)(dVar2 * dVar3);
  fVar1 = glm::radians<float>(this->Pitch);
  dVar2 = sin((double)fVar1);
  local_18 = (float)dVar2;
  fVar1 = glm::radians<float>(this->Yaw);
  dVar2 = sin((double)fVar1);
  fVar1 = glm::radians<float>(this->Pitch);
  dVar3 = cos((double)fVar1);
  front.field_0.x = (float)(dVar2 * dVar3);
  vVar4 = glm::normalize<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)&local_1c);
  local_38.field_2 = vVar4.field_2;
  local_20 = local_38.field_2;
  local_38._0_8_ = vVar4._0_8_;
  local_28._0_4_ = local_38.field_0;
  local_28._4_4_ = local_38.field_1;
  (this->Front).field_2 = local_38.field_2;
  (this->Front).field_0 = local_38.field_0;
  (this->Front).field_1 = local_38.field_1;
  local_38 = vVar4;
  vVar4 = glm::cross<float,(glm::qualifier)0>(&this->Front,&this->WorldUp);
  local_68.field_2 = vVar4.field_2;
  local_58.field_2 = local_68.field_2;
  local_68._0_8_ = vVar4._0_8_;
  local_58.field_0 = local_68.field_0;
  local_58.field_1 = local_68.field_1;
  local_68 = vVar4;
  vVar4 = glm::normalize<3,float,(glm::qualifier)0>(&local_58);
  local_78.field_2 = vVar4.field_2;
  local_40 = local_78.field_2;
  local_78._0_8_ = vVar4._0_8_;
  local_48._0_4_ = local_78.field_0;
  local_48._4_4_ = local_78.field_1;
  (this->Right).field_2 = local_78.field_2;
  (this->Right).field_0 = local_78.field_0;
  (this->Right).field_1 = local_78.field_1;
  local_78 = vVar4;
  vVar4 = glm::cross<float,(glm::qualifier)0>(&this->Right,&this->Front);
  local_a0.field_2 = vVar4.field_2;
  local_90[0].field_2 = local_a0.field_2;
  local_a0._0_8_ = vVar4._0_8_;
  local_90[0].field_0 = local_a0.field_0;
  local_90[0].field_1 = local_a0.field_1;
  vVar4 = glm::normalize<3,float,(glm::qualifier)0>(local_90);
  local_b0 = vVar4._0_8_;
  local_a8 = vVar4.field_2;
  (this->Up).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_b0;
  (this->Up).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_b0._4_4_;
  (this->Up).field_2 = local_a8;
  return;
}

Assistant:

void updateCameraVectors() {
        // Calculate the new Front vector
        glm::vec3 front;
        front.x = cos(glm::radians(this->Yaw)) * cos(glm::radians(this->Pitch));
        front.y = sin(glm::radians(this->Pitch));
        front.z = sin(glm::radians(this->Yaw)) * cos(glm::radians(this->Pitch));
        // Normalize the vectors, because their length gets closer to 0 the more you look up or down
        // which results in slower movement.
        this->Front = glm::normalize(front);
        // Also re-calculate the Right and Up vector
        this->Right = glm::normalize(glm::cross(this->Front, this->WorldUp));
        this->Up = glm::normalize(glm::cross(this->Right, this->Front));
    }